

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchDisplacement(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size)

{
  byte bVar1;
  ND_UINT64 NVar2;
  uint local_44;
  byte local_31;
  ND_UINT8 displSize;
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if ((*(uint *)Instrux >> 6 & 3) == 0) {
    local_31 = gDispsizemap16[(Instrux->ModRm).ModRm >> 6][(Instrux->ModRm).ModRm & 7];
  }
  else {
    if ((*(uint *)&Instrux->field_0x5 >> 0xc & 1) == 0) {
      bVar1 = (Instrux->ModRm).ModRm;
    }
    else {
      bVar1 = (Instrux->Sib).Sib;
    }
    local_44 = (uint)(bVar1 & 7);
    local_31 = gDispsizemap[(Instrux->ModRm).ModRm >> 6][(int)local_44];
  }
  if (local_31 != 0) {
    if (Size < (ulong)Offset + (ulong)local_31) {
      return 0x80000001;
    }
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xffffdfff | 0x2000;
    NVar2 = NdFetchData(Code + (int)(uint)Offset,local_31);
    (Instrux->field_74).Displacement = (ND_UINT32)NVar2;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xfffffffffff0ffff | ((ulong)local_31 & 0xf) << 0x10;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xfff0ffffffffffff | ((ulong)Offset & 0xf) << 0x30;
    Instrux->Length = Instrux->Length + local_31;
    if (0xf < Instrux->Length) {
      return 0x80000003;
    }
  }
  return 0;
}

Assistant:

static NDSTATUS
NdFetchDisplacement(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size
    )
//
// Will decode the displacement from the instruction. Will fill in extracted information in Instrux,
// and will update the instruction length.
//
{
    ND_UINT8 displSize;

    displSize = 0;

    if (ND_ADDR_16 == Instrux->AddrMode)
    {
        displSize = gDispsizemap16[Instrux->ModRm.mod][Instrux->ModRm.rm];
    }
    else
    {
        displSize = gDispsizemap[Instrux->ModRm.mod][Instrux->HasSib ? Instrux->Sib.base : Instrux->ModRm.rm];
    }

    if (0 != displSize)
    {
        // Make sure enough buffer space is available.
        RET_GT((ND_SIZET)Offset + displSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

        // If we get here, we have displacement.
        Instrux->HasDisp = ND_TRUE;

        Instrux->Displacement = (ND_UINT32)NdFetchData(Code + Offset, displSize);

        // Fill in displacement info.
        Instrux->DispLength = displSize;
        Instrux->DispOffset = Offset;
        Instrux->Length += displSize;
        if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
        {
            return ND_STATUS_INSTRUCTION_TOO_LONG;
        }
    }

    return ND_STATUS_SUCCESS;
}